

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__png_is16(stbi__context *s)

{
  int iVar1;
  undefined1 local_40 [8];
  stbi__png p;
  stbi__context *s_local;
  
  local_40 = (undefined1  [8])s;
  p._32_8_ = s;
  iVar1 = stbi__png_info_raw((stbi__png *)local_40,(int *)0x0,(int *)0x0,(int *)0x0);
  if (iVar1 == 0) {
    s_local._4_4_ = 0;
  }
  else if ((int)p.out == 0x10) {
    s_local._4_4_ = 1;
  }
  else {
    stbi__rewind((stbi__context *)local_40);
    s_local._4_4_ = 0;
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__png_is16(stbi__context *s)
{
   stbi__png p;
   p.s = s;
   if (!stbi__png_info_raw(&p, NULL, NULL, NULL))
       return 0;
   if (p.depth != 16) {
      stbi__rewind(p.s);
      return 0;
   }
   return 1;
}